

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void wavWrite_int16(char *filename,int16_t *buffer,int sampleRate,uint64_t totalSampleCount,
                   uint32_t channels)

{
  drwav *pdVar1;
  drwav *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RDI;
  undefined4 in_R8D;
  drwav_uint64 samplesWritten;
  drwav *pWav;
  drwav_data_format format;
  drwav_data_format *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar2 = 0x10;
  pdVar1 = drwav_open_file_write(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (pdVar1 != (drwav *)0x0) {
    pdVar1 = (drwav *)drwav_write((drwav *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                                  (drwav_uint64)in_RCX,(void *)CONCAT44(in_R8D,uVar2));
    drwav_uninit(in_RCX);
    if (pdVar1 != in_RCX) {
      fprintf(_stderr,"write file [%s] error.\n",in_RDI);
      exit(1);
    }
  }
  return;
}

Assistant:

void wavWrite_int16(char *filename, int16_t *buffer, int sampleRate, uint64_t totalSampleCount, uint32_t channels) {
    drwav_data_format format;
    format.container = drwav_container_riff;
    format.format = DR_WAVE_FORMAT_PCM;
    format.channels = channels;
    format.sampleRate = (drwav_uint32) sampleRate;
    format.bitsPerSample = 16;

    drwav *pWav = drwav_open_file_write(filename, &format);
    if (pWav) {
        drwav_uint64 samplesWritten = drwav_write(pWav, totalSampleCount, buffer);
        drwav_uninit(pWav);
        if (samplesWritten != totalSampleCount) {
            fprintf(stderr, "write file [%s] error.\n", filename);
            exit(1);
        }
    }
}